

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::EquivTransitions
          (TimeZoneInfo *this,uint_fast8_t tt1_index,uint_fast8_t tt2_index)

{
  pointer pTVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (tt1_index == tt2_index) {
    return true;
  }
  pTVar1 = (this->transition_types_).
           super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (ulong)((uint)tt1_index * 0x30);
  uVar3 = (ulong)((uint)tt2_index * 0x30);
  if (*(int *)((long)&pTVar1->utc_offset + uVar2) == *(int *)((long)&pTVar1->utc_offset + uVar3)) {
    if ((&pTVar1->is_dst)[uVar2] == (&pTVar1->is_dst)[uVar3]) {
      return (&pTVar1->abbr_index)[uVar2] == (&pTVar1->abbr_index)[uVar3];
    }
  }
  return false;
}

Assistant:

bool TimeZoneInfo::EquivTransitions(std::uint_fast8_t tt1_index,
                                    std::uint_fast8_t tt2_index) const {
  if (tt1_index == tt2_index) return true;
  const TransitionType& tt1(transition_types_[tt1_index]);
  const TransitionType& tt2(transition_types_[tt2_index]);
  if (tt1.utc_offset != tt2.utc_offset) return false;
  if (tt1.is_dst != tt2.is_dst) return false;
  if (tt1.abbr_index != tt2.abbr_index) return false;
  return true;
}